

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O2

int __thiscall
sjtu::FileManager<sjtu::userType>::init(FileManager<sjtu::userType> *this,EVP_PKEY_CTX *ctx)

{
  fstream *file_;
  byte bVar1;
  int iVar2;
  LRUCache<sjtu::userType> *pLVar3;
  byte in_CL;
  uint in_EDX;
  ifstream infile;
  ofstream outfile;
  
  pLVar3 = (this->super_FileManager_Base<sjtu::userType>).cache;
  if (pLVar3 != (LRUCache<sjtu::userType> *)0x0) {
    LRUCache<sjtu::userType>::~LRUCache(pLVar3);
    operator_delete(pLVar3,0x48);
  }
  pLVar3 = (LRUCache<sjtu::userType> *)operator_new(0x48);
  file_ = &(this->super_FileManager_Base<sjtu::userType>).file;
  LRUCache<sjtu::userType>::LRUCache(pLVar3,(ulong)in_EDX,file_);
  (this->super_FileManager_Base<sjtu::userType>).cache = pLVar3;
  std::ifstream::ifstream(&infile,(string *)ctx,_S_in);
  bVar1 = std::__basic_file<char>::is_open();
  if ((byte)(bVar1 ^ 1 | in_CL) == 1) {
    (this->super_FileManager_Base<sjtu::userType>).is_newfile = true;
    std::ofstream::ofstream(&outfile,(string *)ctx,_S_out|_S_bin);
    std::ofstream::close();
    std::ofstream::~ofstream(&outfile);
  }
  else {
    (this->super_FileManager_Base<sjtu::userType>).is_newfile = false;
  }
  std::ifstream::close();
  std::fstream::open((string *)file_,(_Ios_Openmode)ctx);
  iVar2 = std::ifstream::~ifstream(&infile);
  return iVar2;
}

Assistant:

virtual void init(std::string filepath , unsigned int cache_size , bool is_reset = false) override
		{
			if (cache) delete cache;
			cache = new LRUCache<T>(cache_size , file);
			std::ifstream infile(filepath , std::ios_base::in);
			if (!infile.is_open() || is_reset)
			{
				is_newfile = true;
				std::ofstream outfile(filepath , std::ios_base::out | std::ios_base::binary);
				outfile.close();
			}else is_newfile = false;
			infile.close();
			file.open(filepath , std::ios_base::in | std::ios_base::out | std::ios_base::binary);
		}